

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_poly_vector.h
# Opt level: O0

void __thiscall
Impl2T<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>_>
::~Impl2T(Impl2T<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>_>
          *this)

{
  Impl2T<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>_>
  *this_local;
  
  (this->super_Interface)._vptr_Interface = (_func_int **)&PTR_function_005cbc68;
  Cookie::~Cookie(&this->cookie);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&this->p);
  poly::
  vector<Interface,_std::allocator<Interface>,_poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>_>
  ::~vector(&this->v);
  Interface::~Interface(&this->super_Interface);
  return;
}

Assistant:

explicit Impl2T(bool throw_on_copy = false)
        : Interface { throw_on_copy }
        , p { new double[137] }
    {
        cookie.set();
    }